

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

LogEst sqlite3LogEst(u64 x)

{
  LogEst y;
  u64 x_local;
  
  y = 0x28;
  x_local = x;
  if (x < 8) {
    if (x < 2) {
      return 0;
    }
    for (; x_local < 8; x_local = x_local << 1) {
      y = y + -10;
    }
  }
  else {
    for (; 0xff < x_local; x_local = x_local >> 4) {
      y = y + 0x28;
    }
    for (; 0xf < x_local; x_local = x_local >> 1) {
      y = y + 10;
    }
  }
  return sqlite3LogEst::a[x_local & 7] + y + -10;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEst(u64 x){
  static LogEst a[] = { 0, 2, 3, 5, 6, 7, 8, 9 };
  LogEst y = 40;
  if( x<8 ){
    if( x<2 ) return 0;
    while( x<8 ){  y -= 10; x <<= 1; }
  }else{
#if GCC_VERSION>=5004000
    int i = 60 - __builtin_clzll(x);
    y += i*10;
    x >>= i;
#else
    while( x>255 ){ y += 40; x >>= 4; }  /*OPTIMIZATION-IF-TRUE*/
    while( x>15 ){  y += 10; x >>= 1; }
#endif
  }
  return a[x&7] + y - 10;
}